

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

RefPtr<wabt::interp::HostFunc> * __thiscall
wabt::interp::Store::
Alloc<wabt::interp::HostFunc,wabt::interp::Store&,wabt::interp::FuncType&,std::function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>&>
          (RefPtr<wabt::interp::HostFunc> *__return_storage_ptr__,Store *this,Store *args,
          FuncType *args_1,
          function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
          *args_2)

{
  _Manager_type p_Var1;
  HostFunc *this_00;
  Ref ref;
  _Any_data local_98;
  _Manager_type local_88;
  _Invoker_type p_Stack_80;
  FuncType local_78;
  HostFunc *local_38;
  
  this_00 = (HostFunc *)operator_new(0xa0);
  local_78.super_ExternType.kind = (args_1->super_ExternType).kind;
  local_78.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00244210;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_78.params,&args_1->params);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_78.results,&args_1->results);
  local_88 = (_Manager_type)0x0;
  p_Stack_80 = (_Invoker_type)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  p_Var1 = (args_2->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)(&local_98,(_Any_data *)args_2,__clone_functor);
    local_88 = (args_2->super__Function_base)._M_manager;
    p_Stack_80 = args_2->_M_invoker;
  }
  HostFunc::HostFunc(this_00,args,&local_78,(Callback *)&local_98);
  local_38 = this_00;
  ref.index = FreeList<wabt::interp::Object*>::New<wabt::interp::HostFunc*>
                        ((FreeList<wabt::interp::Object*> *)&this->objects_,&local_38);
  if (local_88 != (_Manager_type)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  local_78.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00244210;
  if (local_78.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.results.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.results.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.params.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.params.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  RefPtr<wabt::interp::HostFunc>::RefPtr(__return_storage_ptr__,this,ref);
  (__return_storage_ptr__->obj_->super_Func).super_Extern.super_Object.self_.index = ref.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}